

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.h
# Opt level: O3

bool __thiscall
GenericFunctionInstanceTypeRequest::operator==
          (GenericFunctionInstanceTypeRequest *this,GenericFunctionInstanceTypeRequest *rhs)

{
  bool bVar1;
  TypeHandle *pTVar2;
  MatchData *pMVar3;
  TypeHandle *pTVar4;
  MatchData *pMVar5;
  
  if ((this->parentType == rhs->parentType) && (this->function == rhs->function)) {
    pTVar2 = (rhs->arguments).head;
    pTVar4 = (this->arguments).head;
    while( true ) {
      if (pTVar4 == (TypeHandle *)0x0 && pTVar2 == (TypeHandle *)0x0) break;
      if (pTVar4 == (TypeHandle *)0x0) {
        return false;
      }
      if (pTVar2 == (TypeHandle *)0x0) {
        return false;
      }
      if (pTVar4->type != pTVar2->type) goto LAB_0020d1e8;
      pTVar2 = pTVar2->next;
      pTVar4 = pTVar4->next;
    }
    pMVar3 = (rhs->aliases).head;
    pMVar5 = (this->aliases).head;
    bVar1 = pMVar5 != (MatchData *)0x0 || pMVar3 != (MatchData *)0x0;
    if (pMVar3 != (MatchData *)0x0 && pMVar5 != (MatchData *)0x0) {
      while ((pMVar5->name == pMVar3->name && (pMVar5->type == pMVar3->type))) {
        pMVar3 = pMVar3->next;
        pMVar5 = pMVar5->next;
        bVar1 = pMVar5 != (MatchData *)0x0 || pMVar3 != (MatchData *)0x0;
        if ((pMVar5 == (MatchData *)0x0) || (pMVar3 == (MatchData *)0x0)) break;
      }
    }
    bVar1 = (bool)(bVar1 ^ 1);
  }
  else {
LAB_0020d1e8:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator==(const GenericFunctionInstanceTypeRequest& rhs) const
	{
		if(parentType != rhs.parentType)
			return false;

		if(function != rhs.function)
			return false;

		for(TypeHandle *leftArg = arguments.head, *rightArg = rhs.arguments.head; leftArg || rightArg; leftArg = leftArg->next, rightArg = rightArg->next)
		{
			if(!leftArg || !rightArg)
				return false;

			if(leftArg->type != rightArg->type)
				return false;
		}

		for(MatchData *leftAlias = aliases.head, *rightAlias = rhs.aliases.head; leftAlias || rightAlias; leftAlias = leftAlias->next, rightAlias = rightAlias->next)
		{
			if(!leftAlias || !rightAlias)
				return false;

			if(leftAlias->name != rightAlias->name || leftAlias->type != rightAlias->type)
				return false;
		}

		return true;
	}